

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs.c
# Opt level: O3

void setup_header(FFSBuffer buf,FMFormat_conflict f,estate s)

{
  int iVar1;
  internal_iovec *piVar2;
  int iVar3;
  size_t sVar4;
  long lVar5;
  size_t size;
  
  iVar1 = (f->server_ID).length;
  iVar3 = iVar1 + 8;
  if (f->variant == 0) {
    iVar3 = iVar1;
  }
  size = (size_t)(int)((-iVar3 & 7U) + iVar3);
  sVar4 = add_to_tmp_buffer(buf,size);
  memcpy((void *)((long)buf->tmp_buffer + sVar4),(f->server_ID).value,(long)(f->server_ID).length);
  lVar5 = (long)(f->server_ID).length;
  memset((void *)((long)buf->tmp_buffer + lVar5 + sVar4),0,size - lVar5);
  piVar2 = s->iovec;
  piVar2->iov_len = size;
  piVar2->iov_offset = sVar4;
  piVar2->iov_base = (void *)0x0;
  s->iovcnt = s->iovcnt + 1;
  s->output_len = size;
  return;
}

Assistant:

void
setup_header(FFSBuffer buf, FMFormat f, estate s) 
{
    int header_size = f->server_ID.length;
    ssize_t tmp_data;	/* offset for header */
    int align_pad;

    if (f->variant) {
	header_size += 8;	/* length info */
    }
    align_pad = (8 - header_size) & 0x7;	/* align to 8 */
    header_size += align_pad;

    tmp_data = add_to_tmp_buffer(buf, header_size);

    memcpy((char *) buf->tmp_buffer + tmp_data, f->server_ID.value,
	   f->server_ID.length);

    memset((char*)buf->tmp_buffer + tmp_data + f->server_ID.length,
	   0, header_size - f->server_ID.length);

    /* fill in an IOV field for the header */
    s->iovec[0].iov_len = header_size;
    s->iovec[0].iov_offset = tmp_data;
    s->iovec[0].iov_base = NULL;	/* offset is in tmp_data */
    s->iovcnt++;
    s->output_len = header_size;
}